

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

int __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::ClassId
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_c01;
  string local_c00;
  TPZDohrSubstruct<std::complex<double>_> local_be0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c00,"TPZDohrPrecond",&local_c01);
  uVar1 = Hash(&local_c00);
  iVar2 = TPZMatrix<std::complex<double>_>::ClassId(&this->super_TPZMatrix<std::complex<double>_>);
  TPZDohrSubstruct<std::complex<double>_>::TPZDohrSubstruct(&local_be0);
  iVar3 = TPZDohrSubstruct<std::complex<double>_>::ClassId(&local_be0);
  TPZDohrSubstruct<std::complex<double>_>::~TPZDohrSubstruct(&local_be0);
  std::__cxx11::string::~string((string *)&local_c00);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZDohrPrecond<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrPrecond") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}